

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18d51b::PointerToMemberType::printLeft(PointerToMemberType *this,OutputStream *s)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StringView R;
  StringView R_00;
  
  (*this->MemberType->_vptr_Node[4])();
  bVar1 = Node::hasArray(this->MemberType,s);
  if (!bVar1) {
    bVar1 = Node::hasFunction(this->MemberType,s);
    if (!bVar1) {
      pcVar3 = " ";
      pcVar2 = "";
      goto LAB_001512bc;
    }
  }
  pcVar3 = "(";
  pcVar2 = "";
LAB_001512bc:
  R.Last = pcVar2;
  R.First = pcVar3;
  OutputStream::operator+=(s,R);
  Node::print(this->ClassType,s);
  R_00.Last = "";
  R_00.First = "::*";
  OutputStream::operator+=(s,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    MemberType->printLeft(s);
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += "(";
    else
      s += " ";
    ClassType->print(s);
    s += "::*";
  }